

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O0

AggregateFunction * duckdb::BitOrFun::GetFunctions(void)

{
  bool bVar1;
  reference pLVar2;
  AggregateFunction *in_RDI;
  LogicalType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  AggregateFunctionSet *bit_or;
  AggregateFunction *in_stack_fffffffffffffce8;
  AggregateFunction *this;
  LogicalType local_300 [24];
  LogicalType local_2e8 [40];
  LogicalType *in_stack_fffffffffffffd40;
  LogicalType *in_stack_fffffffffffffd48;
  LogicalType local_1a0 [40];
  LogicalType *in_stack_fffffffffffffe88;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_48 [3];
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  duckdb::AggregateFunctionSet::AggregateFunctionSet((AggregateFunctionSet *)in_RDI);
  duckdb::LogicalType::Integral();
  local_18 = local_30;
  local_48[0]._M_current =
       (LogicalType *)
       std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                  in_stack_fffffffffffffce8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             in_stack_fffffffffffffce8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)this,(__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                                     *)in_stack_fffffffffffffce8), bVar1) {
    pLVar2 = __gnu_cxx::
             __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
             ::operator*(local_48);
    duckdb::LogicalType::LogicalType(local_1a0,pLVar2);
    GetBitfieldUnaryAggregate<duckdb::BitOrOperation>(in_stack_fffffffffffffe88);
    FunctionSet<duckdb::AggregateFunction>::AddFunction
              ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_fffffffffffffce8);
    AggregateFunction::~AggregateFunction(this);
    duckdb::LogicalType::~LogicalType(local_1a0);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(local_48);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x82c8b8);
  duckdb::LogicalType::LogicalType(local_2e8,BIT);
  duckdb::LogicalType::LogicalType(local_300,BIT);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::BitState<duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::BitStringOrOperation,(duckdb::AggregateDestructorType)0>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_fffffffffffffce8);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_300);
  duckdb::LogicalType::~LogicalType(local_2e8);
  return in_RDI;
}

Assistant:

AggregateFunctionSet BitOrFun::GetFunctions() {
	AggregateFunctionSet bit_or;
	for (auto &type : LogicalType::Integral()) {
		bit_or.AddFunction(GetBitfieldUnaryAggregate<BitOrOperation>(type));
	}
	bit_or.AddFunction(
	    AggregateFunction::UnaryAggregateDestructor<BitState<string_t>, string_t, string_t, BitStringOrOperation>(
	        LogicalType::BIT, LogicalType::BIT));
	return bit_or;
}